

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O1

int ext_loader_impl_initialize_types(loader_impl impl)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  long lVar4;
  bool bVar5;
  
  uVar2 = 0;
  bVar5 = true;
  do {
    uVar3 = type_id_name(uVar2);
    lVar4 = type_create(uVar2,uVar3,0,0);
    if (lVar4 != 0) {
      uVar3 = type_name(lVar4);
      iVar1 = loader_impl_type_define(impl,uVar3,lVar4);
      if (iVar1 != 0) {
        type_destroy(lVar4);
        break;
      }
    }
    bVar5 = uVar2 < 0x12;
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x13);
  return (uint)bVar5;
}

Assistant:

int ext_loader_impl_initialize_types(loader_impl impl)
{
	for (type_id index = 0; index < TYPE_SIZE; ++index)
	{
		type t = type_create(index, type_id_name(index), NULL, NULL);

		if (t != NULL)
		{
			if (loader_impl_type_define(impl, type_name(t), t) != 0)
			{
				type_destroy(t);
				return 1;
			}
		}
	}

	return 0;
}